

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O2

bool __thiscall sjtu::timeType::operator<(timeType *this,timeType *other)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)this->month;
  if (this->month < 1) {
    uVar2 = uVar4;
  }
  iVar1 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = iVar1 + *(int *)(months + uVar4 * 4 + 4);
  }
  uVar4 = 0;
  uVar2 = (ulong)(uint)other->month;
  if (other->month < 1) {
    uVar2 = uVar4;
  }
  iVar3 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar3 = iVar3 + *(int *)(months + uVar4 * 4 + 4);
  }
  return ((this->day + iVar1) * 0x18 + this->hour) * 0x3c + this->minute <
         ((iVar3 + other->day) * 0x18 + other->hour) * 0x3c + other->minute;
}

Assistant:

bool timeType::operator<(const timeType &other) const {
            int tmp1 = 0, tmp2 = 0;
            for (int i = 1; i <= month; ++i)
                tmp1 += months[i];
            tmp1 += day;
            tmp1 *= 24;
            tmp1 += hour;
            tmp1 *= 60;
            tmp1 += minute;
            for (int i = 1; i <= other.month; ++i)
                tmp2 += other.months[i];
            tmp2 += other.day;
            tmp2 *= 24;
            tmp2 += other.hour;
            tmp2 *= 60;
            tmp2 += other.minute;
            return (tmp1 < tmp2);
        }